

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxPreIncrDecr::Emit(FxPreIncrDecr *this,VMFunctionBuilder *build)

{
  byte bVar1;
  uint opc;
  int iVar2;
  int opcode;
  uint opa;
  uint opb;
  uint opc_00;
  uint extraout_var;
  bool bVar3;
  bool local_51;
  ExpEmit local_40;
  ExpEmit local_38;
  ExpEmit value;
  ExpEmit pointer;
  int regtype;
  int zero;
  VMFunctionBuilder *build_local;
  FxPreIncrDecr *this_local;
  
  bVar3 = true;
  if (this->Token != 0x119) {
    bVar3 = this->Token == 0x11a;
  }
  if (!bVar3) {
    __assert_fail("Token == TK_Incr || Token == TK_Decr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x80d,"virtual ExpEmit FxPreIncrDecr::Emit(VMFunctionBuilder *)");
  }
  local_51 = false;
  if ((this->super_FxExpression).ValueType == this->Base->ValueType) {
    local_51 = FxExpression::IsNumeric(&this->super_FxExpression);
  }
  if (local_51 == false) {
    __assert_fail("ValueType == Base->ValueType && IsNumeric()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x80e,"virtual ExpEmit FxPreIncrDecr::Emit(VMFunctionBuilder *)");
  }
  opc = VMFunctionBuilder::GetConstantInt(build,0);
  iVar2 = PType::GetRegType((this->super_FxExpression).ValueType);
  local_38._0_4_ = (*this->Base->_vptr_FxExpression[9])(this->Base,build);
  local_38.Konst = (bool)(char)extraout_var;
  local_38.Fixed = (bool)(char)(extraout_var >> 8);
  local_38.Final = (bool)(char)(extraout_var >> 0x10);
  local_38.Target = (bool)(char)(extraout_var >> 0x18);
  value = local_38;
  if ((extraout_var & 0x1000000) == 0) {
    ExpEmit::ExpEmit(&local_40,build,iVar2,1);
    local_38 = local_40;
    opcode = PType::GetLoadOp((this->super_FxExpression).ValueType);
    VMFunctionBuilder::Emit(build,opcode,(uint)local_38.RegNum,(uint)value.RegNum,opc);
  }
  if (iVar2 == 0) {
    bVar1 = 0xff;
    if (this->Token == 0x119) {
      bVar1 = 1;
    }
    VMFunctionBuilder::Emit(build,0x65,(uint)local_38.RegNum,(uint)local_38.RegNum,(uint)bVar1);
  }
  else {
    iVar2 = 0x9a;
    if (this->Token == 0x119) {
      iVar2 = 0x98;
    }
    opa = (uint)local_38.RegNum;
    opb = (uint)local_38.RegNum;
    opc_00 = VMFunctionBuilder::GetConstantFloat(build,1.0);
    VMFunctionBuilder::Emit(build,iVar2,opa,opb,opc_00);
  }
  if (((ulong)value & 0x100000000000000) == 0) {
    iVar2 = PType::GetStoreOp((this->super_FxExpression).ValueType);
    VMFunctionBuilder::Emit(build,iVar2,(uint)value.RegNum,(uint)local_38.RegNum,opc);
  }
  if ((this->AddressRequested & 1U) == 0) {
    ExpEmit::Free(&value,build);
    this_local = (FxPreIncrDecr *)local_38;
  }
  else {
    ExpEmit::Free(&local_38,build);
    this_local = (FxPreIncrDecr *)value;
  }
  return (ExpEmit)this_local;
}

Assistant:

ExpEmit FxPreIncrDecr::Emit(VMFunctionBuilder *build)
{
	assert(Token == TK_Incr || Token == TK_Decr);
	assert(ValueType == Base->ValueType && IsNumeric());

	int zero = build->GetConstantInt(0);
	int regtype = ValueType->GetRegType();
	ExpEmit pointer = Base->Emit(build);
	ExpEmit value = pointer;

	if (!pointer.Target)
	{
		value = ExpEmit(build, regtype);
		build->Emit(ValueType->GetLoadOp(), value.RegNum, pointer.RegNum, zero);
	}

	if (regtype == REGT_INT)
	{
		build->Emit(OP_ADDI, value.RegNum, value.RegNum, uint8_t((Token == TK_Incr) ? 1 : -1));
	}
	else
	{
		build->Emit((Token == TK_Incr) ? OP_ADDF_RK : OP_SUBF_RK, value.RegNum, value.RegNum, build->GetConstantFloat(1.));
	}

	if (!pointer.Target)
	{
		build->Emit(ValueType->GetStoreOp(), pointer.RegNum, value.RegNum, zero);
	}

	if (AddressRequested)
	{
		value.Free(build);
		return pointer;
	}

	pointer.Free(build);
	return value;
}